

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool nlohmann::json_abi_v3_11_3::operator==(const_reference lhs,const_reference rhs)

{
  number_integer_t nVar1;
  value_t vVar2;
  value_t vVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  value_t rhs_type;
  value_t lhs_type;
  const_reference rhs_local;
  const_reference lhs_local;
  
  vVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::type(lhs);
  vVar3 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::type(rhs);
  if (vVar2 == vVar3) {
    switch(vVar2) {
    case null:
      lhs_local._7_1_ = true;
      break;
    case object:
      lhs_local._7_1_ = std::operator==((lhs->m_data).m_value.object,(rhs->m_data).m_value.object);
      break;
    case array:
      lhs_local._7_1_ =
           std::operator==((vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            *)(lhs->m_data).m_value.object,
                           (vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            *)(rhs->m_data).m_value.object);
      break;
    case string:
      lhs_local._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lhs->m_data).m_value.object,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (rhs->m_data).m_value.object);
      break;
    case boolean:
      lhs_local._7_1_ = ((lhs->m_data).m_value.boolean & 1U) == ((rhs->m_data).m_value.boolean & 1U)
      ;
      break;
    case number_integer:
      lhs_local._7_1_ = (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
      break;
    case number_unsigned:
      lhs_local._7_1_ = (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
      break;
    case number_float:
      lhs_local._7_1_ = (lhs->m_data).m_value.number_float == (rhs->m_data).m_value.number_float;
      break;
    case binary:
      lhs_local._7_1_ =
           byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator==((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(lhs->m_data).m_value.object,
                        (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(rhs->m_data).m_value.object);
      break;
    case discarded:
    default:
      lhs_local._7_1_ = false;
    }
  }
  else if ((vVar2 == number_integer) && (vVar3 == number_float)) {
    lhs_local._7_1_ =
         (double)(lhs->m_data).m_value.number_integer == (rhs->m_data).m_value.number_float;
  }
  else if ((vVar2 == number_float) && (vVar3 == number_integer)) {
    lhs_local._7_1_ =
         (lhs->m_data).m_value.number_float == (double)(rhs->m_data).m_value.number_integer;
  }
  else if ((vVar2 == number_unsigned) && (vVar3 == number_float)) {
    nVar1 = (lhs->m_data).m_value.number_integer;
    auVar5._8_4_ = (int)((ulong)nVar1 >> 0x20);
    auVar5._0_8_ = nVar1;
    auVar5._12_4_ = 0x45300000;
    lhs_local._7_1_ =
         (auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) ==
         (rhs->m_data).m_value.number_float;
  }
  else if ((vVar2 == number_float) && (vVar3 == number_unsigned)) {
    nVar1 = (rhs->m_data).m_value.number_integer;
    auVar6._8_4_ = (int)((ulong)nVar1 >> 0x20);
    auVar6._0_8_ = nVar1;
    auVar6._12_4_ = 0x45300000;
    lhs_local._7_1_ =
         (lhs->m_data).m_value.number_float ==
         (auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0);
  }
  else if ((vVar2 == number_unsigned) && (vVar3 == number_integer)) {
    lhs_local._7_1_ = (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
  }
  else if ((vVar2 == number_integer) && (vVar3 == number_unsigned)) {
    lhs_local._7_1_ = (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
  }
  else {
    bVar4 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::compares_unordered(lhs,rhs,false);
    if (bVar4) {
      lhs_local._7_1_ = false;
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
  return lhs_local._7_1_;
}

Assistant:

friend bool operator==(const_reference lhs, const_reference rhs) noexcept
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
        JSON_IMPLEMENT_OPERATOR( ==, true, false, false)
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
    }